

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_ldxs(DisasContext_conflict6 *ctx,int base,int index,int rd)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int rd_local;
  int index_local;
  int base_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx_00);
  t_00 = tcg_temp_new_i64(tcg_ctx_00);
  gen_load_gpr(tcg_ctx_00,t,base);
  if (index != 0) {
    gen_load_gpr(tcg_ctx_00,t_00,index);
    tcg_gen_shli_i64_mips64el(tcg_ctx_00,t_00,t_00,2);
    gen_op_addr_add(ctx,t,t_00,t);
  }
  tcg_gen_qemu_ld_i64_mips64el(tcg_ctx_00,t_00,t,(long)ctx->mem_idx,MO_LESL);
  gen_store_gpr(tcg_ctx_00,t_00,rd);
  tcg_temp_free_i64(tcg_ctx_00,t);
  tcg_temp_free_i64(tcg_ctx_00,t_00);
  return;
}

Assistant:

static void gen_ldxs(DisasContext *ctx, int base, int index, int rd)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, base);

    if (index != 0) {
        gen_load_gpr(tcg_ctx, t1, index);
        tcg_gen_shli_tl(tcg_ctx, t1, t1, 2);
        gen_op_addr_add(ctx, t0, t1, t0);
    }

    tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TESL);
    gen_store_gpr(tcg_ctx, t1, rd);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}